

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int CVodeSetJacTimes(void *cvode_mem,CVLsJacTimesSetupFn jtsetup,CVLsJacTimesVecFn jtimes)

{
  int iVar1;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetJacTimes",&cv_mem,&cvls_mem);
  if (iVar1 == 0) {
    if (cvls_mem->LS->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
      iVar1 = -3;
      cvProcessError(cv_mem,-3,"CVLS","CVodeSetJacTimes",
                     "SUNLinearSolver object does not support user-supplied ATimes routine");
    }
    else {
      if (jtimes == (CVLsJacTimesVecFn)0x0) {
        cvls_mem->jtimesDQ = 1;
        cvls_mem->jtsetup = (CVLsJacTimesSetupFn)0x0;
        cvls_mem->jtimes = cvLsDQJtimes;
        cvls_mem->jt_f = cv_mem->cv_f;
      }
      else {
        cvls_mem->jtimesDQ = 0;
        cvls_mem->jtsetup = jtsetup;
        cvls_mem->jtimes = jtimes;
        cv_mem = (CVodeMem)cv_mem->cv_user_data;
      }
      cvls_mem->jt_data = cv_mem;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int CVodeSetJacTimes(void *cvode_mem, CVLsJacTimesSetupFn jtsetup,
                     CVLsJacTimesVecFn jtimes)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeSetJacTimes",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* issue error if LS object does not allow user-supplied ATimes */
  if (cvls_mem->LS->ops->setatimes == NULL) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                    "CVodeSetJacTimes",
                    "SUNLinearSolver object does not support user-supplied ATimes routine");
    return(CVLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in CVLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL) {
    cvls_mem->jtimesDQ = SUNFALSE;
    cvls_mem->jtsetup  = jtsetup;
    cvls_mem->jtimes   = jtimes;
    cvls_mem->jt_data  = cv_mem->cv_user_data;
  } else {
    cvls_mem->jtimesDQ = SUNTRUE;
    cvls_mem->jtsetup  = NULL;
    cvls_mem->jtimes   = cvLsDQJtimes;
    cvls_mem->jt_f     = cv_mem->cv_f;
    cvls_mem->jt_data  = cv_mem;
  }

  return(CVLS_SUCCESS);
}